

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

Gia_Man_t * Gia_ManOrigIdsReduce(Gia_Man_t *p,Vec_Int_t *vPairs)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  Vec_Int_t *__ptr;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Vec_Int_t *pVVar11;
  Gia_Obj_t *pGVar12;
  Gia_Rpr_t *pGVar13;
  int *piVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  
  __ptr = Gia_ManOrigIdsRemapPairs(vPairs,p->nObjs);
  Gia_ManSetPhase(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar2);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar2);
  }
  p_00->pSpec = pcVar10;
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar2);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar2);
  }
  p_00->pName = pcVar10;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar17 = 0;
    do {
      iVar7 = pVVar11->pArray[lVar17];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_001fcda3;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar12 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar5 = p_00->pObjs;
      if ((pGVar12 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar12)) {
LAB_001fcdc2:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar12 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar12)) goto LAB_001fcdc2;
      pGVar3[iVar7].Value = (int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      pVVar11 = p->vCis;
    } while (lVar17 < pVVar11->nSize);
  }
  Gia_ManHashAlloc(p_00);
  uVar8 = p->nObjs;
  if (0 < (int)uVar8) {
    lVar17 = 8;
    lVar16 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar4 = *(ulong *)((long)pGVar3 + lVar17 + -8);
      if ((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar4) {
        if (__ptr->nSize <= lVar16) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar1 = __ptr->pArray[lVar16];
        uVar15 = (ulong)uVar1;
        uVar6 = (uint)(uVar4 >> 0x20);
        if (uVar15 == 0xffffffff) {
          uVar8 = *(uint *)((long)pGVar3 +
                           lVar17 + (ulong)(uint)((int)(uVar4 & 0x1fffffff) << 2) * -3);
          if (((int)uVar8 < 0) ||
             (uVar1 = *(uint *)((long)pGVar3 +
                               lVar17 + (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3),
             (int)uVar1 < 0)) goto LAB_001fcde1;
          iVar7 = Gia_ManHashAnd(p_00,uVar8 ^ (uint)(uVar4 >> 0x1d) & 1,uVar1 ^ uVar6 >> 0x1d & 1);
          *(int *)(&pGVar3->field_0x0 + lVar17) = iVar7;
          uVar8 = p->nObjs;
        }
        else {
          if (((int)uVar1 < 0) || (uVar8 <= uVar1)) goto LAB_001fcda3;
          if ((int)pGVar3[uVar15].Value < 0) goto LAB_001fcde1;
          *(uint *)(&pGVar3->field_0x0 + lVar17) =
               pGVar3[uVar15].Value ^
               (uVar6 ^ (uint)((ulong)*(undefined8 *)(pGVar3 + uVar15) >> 0x20)) >> 0x1f;
        }
      }
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0xc;
    } while (lVar16 < (int)uVar8);
  }
  Gia_ManHashStop(p_00);
  pVVar11 = p->vCos;
  if (0 < pVVar11->nSize) {
    lVar17 = 0;
    do {
      iVar7 = pVVar11->pArray[lVar17];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_001fcda3;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar7;
      if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
LAB_001fcde1:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar8 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                   pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value)
      ;
      pGVar3->Value = uVar8;
      lVar17 = lVar17 + 1;
      pVVar11 = p->vCos;
    } while (lVar17 < pVVar11->nSize);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if ((p->pReprs != (Gia_Rpr_t *)0x0) || (p->pNexts != (int *)0x0)) {
    __assert_fail("!p->pReprs && !p->pNexts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                  ,0x87,"Gia_Man_t *Gia_ManOrigIdsReduce(Gia_Man_t *, Vec_Int_t *)");
  }
  iVar7 = p->nObjs;
  pGVar13 = (Gia_Rpr_t *)calloc((long)iVar7,4);
  p->pReprs = pGVar13;
  if (0 < (long)iVar7) {
    lVar17 = 0;
    do {
      p->pReprs[lVar17] = (Gia_Rpr_t)((uint)p->pReprs[lVar17] | 0xfffffff);
      lVar17 = lVar17 + 1;
    } while (lVar17 < p->nObjs);
  }
  Gia_ManFillValue(p_00);
  if (0 < p->nObjs) {
    lVar17 = 2;
    lVar16 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar8 = *(uint *)((long)pGVar3 + lVar17 * 4 + -8);
      if ((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) {
        uVar8 = *(uint *)(&pGVar3->field_0x0 + lVar17 * 4);
        if ((int)uVar8 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (uVar8 < 2) {
          if (lVar16 == 0) {
LAB_001fce3e:
            __assert_fail("Num == GIA_VOID || Num < Id",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x401,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
          }
          p->pReprs[lVar16] = (Gia_Rpr_t)((uint)p->pReprs[lVar16] & 0xf0000000);
        }
        else {
          uVar8 = uVar8 >> 1;
          if (p_00->nObjs <= (int)uVar8) {
LAB_001fcda3:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar1 = p_00->pObjs[uVar8].Value;
          if ((long)(int)uVar1 == -1) {
            p_00->pObjs[uVar8].Value = (uint)lVar16;
          }
          else {
            if (lVar16 <= (int)uVar1 && uVar1 != 0xfffffff) goto LAB_001fce3e;
            p->pReprs[lVar16] =
                 (Gia_Rpr_t)((uint)p->pReprs[lVar16] & 0xf0000000 | uVar1 & 0xfffffff);
          }
        }
      }
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 3;
    } while (lVar16 < p->nObjs);
  }
  piVar14 = Gia_ManDeriveNexts(p);
  p->pNexts = piVar14;
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManOrigIdsReduce( Gia_Man_t * p, Vec_Int_t * vPairs )
{
    Gia_Man_t * pNew = NULL;
    Gia_Obj_t * pObj, * pRepr; int i;
    Vec_Int_t * vMap = Gia_ManOrigIdsRemapPairs( vPairs, Gia_ManObjNum(p) );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Vec_IntEntry(vMap, i) == -1 )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
        {
            pRepr = Gia_ManObj( p, Vec_IntEntry(vMap, i) );
            pObj->Value = Abc_LitNotCond( pRepr->Value, pRepr->fPhase ^ pObj->fPhase );
        }
    }
    Gia_ManHashStop( pNew );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Vec_IntFree( vMap );
    // compute equivalences
    assert( !p->pReprs && !p->pNexts );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Gia_ObjSetRepr( p, i, GIA_VOID );
    Gia_ManFillValue(pNew);
    Gia_ManForEachAnd( p, pObj, i )
    {
        int iRepr = Abc_Lit2Var(pObj->Value);
        if ( iRepr == 0 )
        {
            Gia_ObjSetRepr( p, i, 0 );
            continue;
        }
        pRepr = Gia_ManObj( pNew, iRepr );
        if ( !~pRepr->Value ) // first time
        {
            pRepr->Value = i;
            continue;
        }
        // add equivalence
        Gia_ObjSetRepr( p, i, pRepr->Value );
    }
    p->pNexts = Gia_ManDeriveNexts( p );
    return pNew;
}